

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O2

RealCanvas<plot::BrailleCanvas> * __thiscall
plot::RealCanvas<plot::BrailleCanvas>::
path<__gnu_cxx::__normal_iterator<plot::GenericPoint<float>*,std::vector<plot::GenericPoint<float>,std::allocator<plot::GenericPoint<float>>>>>
          (RealCanvas<plot::BrailleCanvas> *this,Color *color,
          __normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
          first,__normal_iterator<plot::GenericPoint<float>_*,_std::vector<plot::GenericPoint<float>,_std::allocator<plot::GenericPoint<float>_>_>_>
                last)

{
  Pointf to;
  RealCanvas<plot::BrailleCanvas> *pRVar1;
  Pointf *pPVar2;
  GenericPoint<float> from;
  
  BrailleCanvas::push(&this->canvas_);
  from = *first._M_current;
  for (pPVar2 = first._M_current + 1; pPVar2 != last._M_current; pPVar2 = pPVar2 + 1) {
    to = *pPVar2;
    line<>(this,color,from,to);
    from = to;
  }
  pRVar1 = pop<>(this);
  return pRVar1;
}

Assistant:

RealCanvas& path(Color const& color, Iterator first, Iterator last, Args&&... args) {
        push();
        auto start = *first;
        while (++first != last) {
            auto end = *first;
            line(color, start, end);
            start = end;
        }
        return pop(std::forward<Args>(args)...);
    }